

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta,double objective_amplifier)

{
  uint *args_1;
  undefined1 auVar1 [16];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  row_iterator prVar6;
  long lVar7;
  long lVar8;
  rc_data *__first;
  uint r_size;
  rc_data *prVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_9c;
  int local_98;
  uint local_94;
  rc_data *local_90;
  int *local_88;
  double local_80;
  bit_array *local_78;
  solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
  *local_70;
  int *local_68;
  undefined8 local_60;
  _Head_base<0UL,_int_*,_false> local_58;
  row_iterator local_50;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_48;
  double local_40;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_38;
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_80 = objective_amplifier;
  local_48._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)(tuple<int_*,_std::default_delete<int[]>_>)theta;
  local_40 = delta;
  local_38._M_head_impl = (row_value *)kappa;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,fmt,(double *)&local_38,&local_40,(double *)&local_48);
  if (first._M_current == last._M_current) {
    local_60 = 0;
  }
  else {
    local_70 = this + 0x10;
    local_60 = 0;
    local_78 = x;
    local_68 = last._M_current;
    do {
      local_9c = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_58,(int)local_70);
      if (local_50 != (row_iterator)local_58._M_head_impl) {
        lVar8 = *(long *)(this + 0x50);
        prVar6 = local_50;
        do {
          piVar2 = &prVar6->value;
          prVar6 = prVar6 + 1;
          *(double *)(lVar8 + (long)*piVar2 * 8) =
               (double)local_48._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl *
               *(double *)(lVar8 + (long)*piVar2 * 8);
        } while (prVar6 != (row_iterator)local_58._M_head_impl);
      }
      uVar4 = solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                          *)this,local_50,(row_iterator)local_58._M_head_impl,x);
      r_size = uVar4;
      if (uVar4 != 0) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_80;
        __first = *(rc_data **)(this + 0x58);
        lVar7 = 0;
        lVar8 = *(long *)(*(long *)(this + 0x70) + 8);
        do {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(lVar8 + (long)*(int *)((long)&__first->id + lVar7) * 8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)((long)&__first->value + lVar7);
          auVar1 = vfmadd213sd_fma(auVar10,auVar11,auVar1);
          *(long *)((long)&__first->value + lVar7) = auVar1._0_8_;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)uVar4 << 4 != lVar7);
        if (1 < (int)uVar4) {
          lVar8 = (long)(int)uVar4;
          __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                 (this + 8);
          prVar9 = __first + lVar8;
          local_94 = uVar4;
          local_88 = first._M_current;
          std::
          __introsort_loop<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,prVar9,(int)LZCOUNT(lVar8) * 2 ^ 0x7e);
          local_90 = prVar9;
          std::
          __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (__first,prVar9);
          lVar8 = lVar8 * 0x10 + -0x10;
          prVar9 = __first;
          do {
            prVar9 = prVar9 + 1;
            if ((__first->value != prVar9->value) || (NAN(__first->value) || NAN(prVar9->value))) {
              std::
              shuffle<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (__first,prVar9,__g);
              __first = prVar9;
            }
            lVar8 = lVar8 + -0x10;
          } while (lVar8 != 0);
          std::
          shuffle<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (__first,local_90,__g);
          first._M_current = local_88;
          r_size = local_94;
        }
      }
      args_1 = (uint *)(*(long *)(this + 0x60) + (long)local_9c * 4);
      uVar5 = *args_1;
      if ((int)r_size < (int)uVar5) {
        uVar5 = r_size;
      }
      local_98 = uVar5 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_9c,(int *)args_1);
      if (0 < (int)r_size) {
        lVar8 = 0;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<double,int>
                    ((debug_logger<true> *)this,fmt_01,(double *)(*(long *)(this + 0x58) + lVar8),
                     (int *)(*(long *)(this + 0x58) + 8 + lVar8));
          lVar8 = lVar8 + 0x10;
        } while ((ulong)uVar4 << 4 != lVar8);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_98);
      x = local_78;
      bVar3 = affect<baryonyx::itm::solver_equalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                        ((solver_equalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                          *)this,local_78,local_50,local_9c,local_98,r_size,
                         (double)local_38._M_head_impl,local_40);
      first._M_current = first._M_current + 1;
      local_60 = CONCAT71((int7)((ulong)local_60 >> 8),(byte)local_60 | bVar3);
    } while (first._M_current != local_68);
  }
  return (bool)((byte)local_60 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }